

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_gcc.cc
# Opt level: O1

void ARGBToRGB24Row_AVX512VBMI(uint8_t *src,uint8_t *dst,int width)

{
  undefined1 (*pauVar1) [32];
  undefined1 (*pauVar2) [32];
  undefined1 (*pauVar3) [32];
  bool bVar4;
  ulvec8 auVar5;
  ulvec8 auVar6;
  ulvec8 auVar7;
  int iVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  
  auVar7 = libyuv::kPermARGBToRGB24_2;
  auVar6 = libyuv::kPermARGBToRGB24_1;
  auVar5 = libyuv::kPermARGBToRGB24_0;
  do {
    auVar9 = *(undefined1 (*) [32])src;
    pauVar1 = (undefined1 (*) [32])((long)src + 0x20);
    pauVar2 = (undefined1 (*) [32])((long)src + 0x40);
    pauVar3 = (undefined1 (*) [32])((long)src + 0x60);
    src = (uint8_t *)((long)src + 0x80);
    auVar9 = vpermt2b_avx512vl(auVar9,(undefined1  [32])auVar5,*pauVar1);
    auVar10 = vpermt2b_avx512vl(*pauVar1,(undefined1  [32])auVar6,*pauVar2);
    auVar11 = vpermt2b_avx512vl(*pauVar2,(undefined1  [32])auVar7,*pauVar3);
    *(undefined1 (*) [32])dst = auVar9;
    *(undefined1 (*) [32])((long)dst + 0x20) = auVar10;
    *(undefined1 (*) [32])((long)dst + 0x40) = auVar11;
    dst = (uint8_t *)((long)dst + 0x60);
    iVar8 = width + -0x20;
    bVar4 = 0x1f < width;
    width = iVar8;
  } while (iVar8 != 0 && bVar4);
  return;
}

Assistant:

void ARGBToRGB24Row_AVX512VBMI(const uint8_t* src, uint8_t* dst, int width) {
  asm volatile(
      "vmovdqa     %3,%%ymm5                     \n"
      "vmovdqa     %4,%%ymm6                     \n"
      "vmovdqa     %5,%%ymm7                     \n"

      LABELALIGN
      "1:                                        \n"
      "vmovdqu     (%0),%%ymm0                   \n"
      "vmovdqu     0x20(%0),%%ymm1               \n"
      "vmovdqu     0x40(%0),%%ymm2               \n"
      "vmovdqu     0x60(%0),%%ymm3               \n"
      "lea         0x80(%0),%0                   \n"
      "vpermt2b    %%ymm1,%%ymm5,%%ymm0          \n"
      "vpermt2b    %%ymm2,%%ymm6,%%ymm1          \n"
      "vpermt2b    %%ymm3,%%ymm7,%%ymm2          \n"
      "vmovdqu     %%ymm0,(%1)                   \n"
      "vmovdqu     %%ymm1,0x20(%1)               \n"
      "vmovdqu     %%ymm2,0x40(%1)               \n"
      "lea         0x60(%1),%1                   \n"
      "sub         $0x20,%2                      \n"
      "jg          1b                            \n"
      "vzeroupper                                \n"
      : "+r"(src),                // %0
        "+r"(dst),                // %1
        "+r"(width)               // %2
      : "m"(kPermARGBToRGB24_0),  // %3
        "m"(kPermARGBToRGB24_1),  // %4
        "m"(kPermARGBToRGB24_2)   // %5
      : "memory", "cc", "xmm0", "xmm1", "xmm2", "xmm3", "xmm5", "xmm6", "xmm7");
}